

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::invalid_write_built_in_constants
               (NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  RenderContext *pRVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  ProgramSources *pPVar5;
  ShaderType shaderType;
  ShaderType shaderType_00;
  ShaderType shaderType_01;
  ShaderType shaderType_02;
  ShaderType shaderType_03;
  ShaderType shaderType_04;
  char *local_e30;
  allocator<char> local_e19;
  string local_e18;
  ProgramSeparable local_df1;
  ProgramSources local_df0;
  undefined1 local_d20 [8];
  ShaderProgram computeProgram;
  ProgramSources local_c48;
  undefined1 local_b78 [8];
  ShaderProgram geometryProgram;
  ProgramSources local_aa0;
  undefined1 local_9d0 [8];
  ShaderProgram tessEvalProgram;
  ProgramSources local_8f8;
  undefined1 local_828 [8];
  ShaderProgram tessCtrlProgram;
  ProgramSources local_750;
  undefined1 local_680 [8];
  ShaderProgram fragProgram;
  ProgramSources local_5a8;
  undefined1 local_4d8 [8];
  ShaderProgram vertProgram;
  StringTemplate local_3e8;
  string local_3c8;
  undefined1 local_3a8 [8];
  ComputeSource computeSource;
  StringTemplate local_360;
  string local_340;
  undefined1 local_320 [8];
  GeometrySource geometrySource;
  StringTemplate local_2d8;
  string local_2b8;
  undefined1 local_298 [8];
  TessellationEvaluationSource tessEvalSource;
  StringTemplate local_250;
  string local_230;
  undefined1 local_210 [8];
  TessellationControlSource tessCtrlSource;
  StringTemplate local_1c8;
  string local_1a8;
  undefined1 local_188 [8];
  FragmentSource fragSource;
  StringTemplate local_140;
  string local_120;
  undefined1 local_100 [8];
  VertexSource vertSource;
  key_type local_d0;
  allocator<char> local_a9;
  key_type local_a8;
  allocator<char> local_81;
  key_type local_80;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  bool isES32;
  NegativeTestContext *ctx_local;
  
  pRVar2 = NegativeTestContext::getRenderContext(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(ctxType,args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  if (bVar1) {
    local_e30 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_e30 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"GLSL_VERSION_STRING",&local_81);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_80);
  std::__cxx11::string::operator=((string *)pmVar3,local_e30);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pcVar4 = "#extension GL_EXT_tessellation_shader : require";
  if (bVar1) {
    pcVar4 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"GLSL_TESS_EXTENSION_STRING",&local_a9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_a8);
  std::__cxx11::string::operator=((string *)pmVar3,pcVar4);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"COMPUTE_BUILT_IN_CONSTANTS_STRING",
             (allocator<char> *)(vertSource.super_ShaderSource.source.field_2._M_local_buf + 0xf));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_d0);
  std::__cxx11::string::operator=
            ((string *)pmVar3,
             "\tgl_MaxComputeWorkGroupCount       = ivec3(65535, 65535, 65535);\n\tgl_MaxComputeWorkGroupCount       = ivec3(1024, 1024, 64);\n\tgl_MaxComputeWorkGroupSize        = ivec3(512);\n\tgl_MaxComputeUniformComponents    = 512;\n\tgl_MaxComputeTextureImageUnits    = 16;\n\tgl_MaxComputeImageUniforms        = 8;\n\tgl_MaxComputeAtomicCounters       = 8;\n\tgl_MaxComputeAtomicCounterBuffers = 1;\n"
            );
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(vertSource.super_ShaderSource.source.field_2._M_local_buf + 0xf));
  NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)((long)&fragSource.super_ShaderSource.source.field_2 + 8),
             (_anonymous_namespace_ *)0x0,shaderType);
  tcu::StringTemplate::StringTemplate
            (&local_140,(string *)((long)&fragSource.super_ShaderSource.source.field_2 + 8));
  tcu::StringTemplate::specialize
            (&local_120,&local_140,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  glu::VertexSource::VertexSource((VertexSource *)local_100,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  tcu::StringTemplate::~StringTemplate(&local_140);
  std::__cxx11::string::~string
            ((string *)(fragSource.super_ShaderSource.source.field_2._M_local_buf + 8));
  NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)((long)&tessCtrlSource.super_ShaderSource.source.field_2 + 8),
             (_anonymous_namespace_ *)&DAT_00000001,shaderType_00);
  tcu::StringTemplate::StringTemplate
            (&local_1c8,(string *)((long)&tessCtrlSource.super_ShaderSource.source.field_2 + 8));
  tcu::StringTemplate::specialize
            (&local_1a8,&local_1c8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_188,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  tcu::StringTemplate::~StringTemplate(&local_1c8);
  std::__cxx11::string::~string
            ((string *)(tessCtrlSource.super_ShaderSource.source.field_2._M_local_buf + 8));
  NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)((long)&tessEvalSource.super_ShaderSource.source.field_2 + 8),
             (_anonymous_namespace_ *)0x3,shaderType_01);
  tcu::StringTemplate::StringTemplate
            (&local_250,(string *)((long)&tessEvalSource.super_ShaderSource.source.field_2 + 8));
  tcu::StringTemplate::specialize
            (&local_230,&local_250,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_210,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  tcu::StringTemplate::~StringTemplate(&local_250);
  std::__cxx11::string::~string
            ((string *)(tessEvalSource.super_ShaderSource.source.field_2._M_local_buf + 8));
  NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)((long)&geometrySource.super_ShaderSource.source.field_2 + 8),
             (_anonymous_namespace_ *)&DAT_00000004,shaderType_02);
  tcu::StringTemplate::StringTemplate
            (&local_2d8,(string *)((long)&geometrySource.super_ShaderSource.source.field_2 + 8));
  tcu::StringTemplate::specialize
            (&local_2b8,&local_2d8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_298,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  tcu::StringTemplate::~StringTemplate(&local_2d8);
  std::__cxx11::string::~string
            ((string *)(geometrySource.super_ShaderSource.source.field_2._M_local_buf + 8));
  NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)((long)&computeSource.super_ShaderSource.source.field_2 + 8),
             (_anonymous_namespace_ *)0x2,shaderType_03);
  tcu::StringTemplate::StringTemplate
            (&local_360,(string *)((long)&computeSource.super_ShaderSource.source.field_2 + 8));
  tcu::StringTemplate::specialize
            (&local_340,&local_360,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  glu::GeometrySource::GeometrySource((GeometrySource *)local_320,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  tcu::StringTemplate::~StringTemplate(&local_360);
  std::__cxx11::string::~string
            ((string *)(computeSource.super_ShaderSource.source.field_2._M_local_buf + 8));
  NegativeTestShared::(anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)&vertProgram.m_program.m_info.linkTimeUs,(_anonymous_namespace_ *)0x5,
             shaderType_04);
  tcu::StringTemplate::StringTemplate(&local_3e8,(string *)&vertProgram.m_program.m_info.linkTimeUs)
  ;
  tcu::StringTemplate::specialize
            (&local_3c8,&local_3e8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  glu::ComputeSource::ComputeSource((ComputeSource *)local_3a8,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  tcu::StringTemplate::~StringTemplate(&local_3e8);
  std::__cxx11::string::~string((string *)&vertProgram.m_program.m_info.linkTimeUs);
  pRVar2 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_5a8);
  glu::ProgramSeparable::ProgramSeparable
            ((ProgramSeparable *)((long)&fragProgram.m_program.m_info.linkTimeUs + 7),true);
  pPVar5 = glu::ProgramSources::operator<<
                     (&local_5a8,
                      (ProgramSeparable *)((long)&fragProgram.m_program.m_info.linkTimeUs + 7));
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_100);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_4d8,pRVar2,pPVar5);
  glu::ProgramSources::~ProgramSources(&local_5a8);
  pRVar2 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_750);
  glu::ProgramSeparable::ProgramSeparable
            ((ProgramSeparable *)((long)&tessCtrlProgram.m_program.m_info.linkTimeUs + 7),true);
  pPVar5 = glu::ProgramSources::operator<<
                     (&local_750,
                      (ProgramSeparable *)((long)&tessCtrlProgram.m_program.m_info.linkTimeUs + 7));
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_188);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_680,pRVar2,pPVar5);
  glu::ProgramSources::~ProgramSources(&local_750);
  pRVar2 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_8f8);
  glu::ProgramSeparable::ProgramSeparable
            ((ProgramSeparable *)((long)&tessEvalProgram.m_program.m_info.linkTimeUs + 7),true);
  pPVar5 = glu::ProgramSources::operator<<
                     (&local_8f8,
                      (ProgramSeparable *)((long)&tessEvalProgram.m_program.m_info.linkTimeUs + 7));
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_210);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_828,pRVar2,pPVar5);
  glu::ProgramSources::~ProgramSources(&local_8f8);
  pRVar2 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_aa0);
  glu::ProgramSeparable::ProgramSeparable
            ((ProgramSeparable *)((long)&geometryProgram.m_program.m_info.linkTimeUs + 7),true);
  pPVar5 = glu::ProgramSources::operator<<
                     (&local_aa0,
                      (ProgramSeparable *)((long)&geometryProgram.m_program.m_info.linkTimeUs + 7));
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_298);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_9d0,pRVar2,pPVar5);
  glu::ProgramSources::~ProgramSources(&local_aa0);
  pRVar2 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_c48);
  glu::ProgramSeparable::ProgramSeparable
            ((ProgramSeparable *)((long)&computeProgram.m_program.m_info.linkTimeUs + 7),true);
  pPVar5 = glu::ProgramSources::operator<<
                     (&local_c48,
                      (ProgramSeparable *)((long)&computeProgram.m_program.m_info.linkTimeUs + 7));
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_320);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_b78,pRVar2,pPVar5);
  glu::ProgramSources::~ProgramSources(&local_c48);
  pRVar2 = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_df0);
  glu::ProgramSeparable::ProgramSeparable(&local_df1,true);
  pPVar5 = glu::ProgramSources::operator<<(&local_df0,&local_df1);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_3a8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_d20,pRVar2,pPVar5);
  glu::ProgramSources::~ProgramSources(&local_df0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e18,
             "A compile time is generated if compute built-in constants provided in all shaders are written to."
             ,&local_e19);
  NegativeTestContext::beginSection(ctx,&local_e18);
  std::__cxx11::string::~string((string *)&local_e18);
  std::allocator<char>::~allocator(&local_e19);
  verifyCompileError(ctx,(ShaderProgram *)local_4d8,SHADERTYPE_VERTEX);
  verifyCompileError(ctx,(ShaderProgram *)local_680,SHADERTYPE_FRAGMENT);
  verifyCompileError(ctx,(ShaderProgram *)local_828,SHADERTYPE_TESSELLATION_CONTROL);
  verifyCompileError(ctx,(ShaderProgram *)local_9d0,SHADERTYPE_TESSELLATION_EVALUATION);
  verifyCompileError(ctx,(ShaderProgram *)local_b78,SHADERTYPE_GEOMETRY);
  verifyCompileError(ctx,(ShaderProgram *)local_d20,SHADERTYPE_COMPUTE);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_d20);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_b78);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_9d0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_828);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_680);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_4d8);
  glu::ComputeSource::~ComputeSource((ComputeSource *)local_3a8);
  glu::GeometrySource::~GeometrySource((GeometrySource *)local_320);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_298);
  glu::TessellationControlSource::~TessellationControlSource((TessellationControlSource *)local_210)
  ;
  glu::FragmentSource::~FragmentSource((FragmentSource *)local_188);
  glu::VertexSource::~VertexSource((VertexSource *)local_100);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_50);
  return;
}

Assistant:

void invalid_write_built_in_constants (NegativeTestContext& ctx)
{
	const bool					isES32			= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>			args;

	args["GLSL_VERSION_STRING"]					=	isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	args["GLSL_TESS_EXTENSION_STRING"]			=	isES32 ? "" : "#extension GL_EXT_tessellation_shader : require";
	args["COMPUTE_BUILT_IN_CONSTANTS_STRING"]	=	"	gl_MaxComputeWorkGroupCount       = ivec3(65535, 65535, 65535);\n"
													"	gl_MaxComputeWorkGroupCount       = ivec3(1024, 1024, 64);\n"
													"	gl_MaxComputeWorkGroupSize        = ivec3(512);\n"
													"	gl_MaxComputeUniformComponents    = 512;\n"
													"	gl_MaxComputeTextureImageUnits    = 16;\n"
													"	gl_MaxComputeImageUniforms        = 8;\n"
													"	gl_MaxComputeAtomicCounters       = 8;\n"
													"	gl_MaxComputeAtomicCounterBuffers = 1;\n";

	const glu::VertexSource					vertSource		(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_VERTEX)).specialize(args));
	const glu::FragmentSource				fragSource		(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_FRAGMENT)).specialize(args));
	const glu::TessellationControlSource	tessCtrlSource	(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_TESSELLATION_CONTROL)).specialize(args));
	const glu::TessellationEvaluationSource	tessEvalSource	(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_TESSELLATION_EVALUATION)).specialize(args));
	const glu::GeometrySource				geometrySource	(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_GEOMETRY)).specialize(args));
	const glu::ComputeSource				computeSource	(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_COMPUTE)).specialize(args));

	glu::ShaderProgram	vertProgram		(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << vertSource);
	glu::ShaderProgram	fragProgram		(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << fragSource);
	glu::ShaderProgram	tessCtrlProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << tessCtrlSource);
	glu::ShaderProgram	tessEvalProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << tessEvalSource);
	glu::ShaderProgram	geometryProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << geometrySource);
	glu::ShaderProgram	computeProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << computeSource);

	ctx.beginSection("A compile time is generated if compute built-in constants provided in all shaders are written to.");
	verifyCompileError(ctx, vertProgram, glu::SHADERTYPE_VERTEX);
	verifyCompileError(ctx, fragProgram, glu::SHADERTYPE_FRAGMENT);
	verifyCompileError(ctx, tessCtrlProgram, glu::SHADERTYPE_TESSELLATION_CONTROL);
	verifyCompileError(ctx, tessEvalProgram, glu::SHADERTYPE_TESSELLATION_EVALUATION);
	verifyCompileError(ctx, geometryProgram, glu::SHADERTYPE_GEOMETRY);
	verifyCompileError(ctx, computeProgram, glu::SHADERTYPE_COMPUTE);
	ctx.endSection();
}